

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O2

bool __thiscall
glcts::ViewportArray::DepthRangeAPI::iterateHelper<double>(DepthRangeAPI *this,double *param_1)

{
  undefined4 *puVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  GLint i;
  ulong uVar10;
  long lVar11;
  bool test_result;
  GLint max_viewports;
  DepthFuncWrapper depthFunc;
  vector<double,_std::allocator<double>_> depth_range_data_b;
  vector<double,_std::allocator<double>_> depth_range_data_a;
  long lVar6;
  
  iVar4 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar4);
  iVar4 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  depthFunc.m_gl = (Functions *)CONCAT44(extraout_var_00,iVar4);
  test_result = true;
  max_viewports = 0;
  (**(code **)(lVar6 + 0x868))(0x825b,&max_viewports);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                  ,0x881);
  depth_range_data_a.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  depth_range_data_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  depth_range_data_a.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  depth_range_data_a.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  depth_range_data_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  depth_range_data_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::resize
            (&depth_range_data_a,(ulong)(uint)(max_viewports * 2));
  std::vector<double,_std::allocator<double>_>::resize
            (&depth_range_data_b,(ulong)(uint)(max_viewports * 2));
  getDepthRanges<double>(this,&depthFunc,max_viewports,&depth_range_data_a);
  lVar7 = 0;
  uVar8 = 0;
  if (0 < max_viewports) {
    uVar8 = (ulong)(uint)max_viewports;
  }
  for (; uVar8 * 0x10 != lVar7; lVar7 = lVar7 + 0x10) {
    dVar2 = ((double *)
            ((long)depth_range_data_a.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar7))[1];
    *(double *)
     ((long)depth_range_data_a.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + lVar7) =
         *(double *)
          ((long)depth_range_data_a.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar7) + 0.125;
    ((double *)
    ((long)depth_range_data_a.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start + lVar7))[1] = dVar2 + -0.125;
  }
  (*(depthFunc.m_gl)->depthRangeArrayv)
            (0,max_viewports,
             depth_range_data_a.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"depthRangeArray",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                  ,0x897);
  getDepthRanges<double>(this,&depthFunc,max_viewports,&depth_range_data_b);
  compareDepthRanges<double>
            (this,&depth_range_data_a,&depth_range_data_b,"depthRangeArray",&test_result);
  lVar11 = 0;
  for (lVar7 = 0; lVar7 < max_viewports; lVar7 = lVar7 + 1) {
    *(undefined8 *)
     ((long)depth_range_data_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + lVar11) = 0x3fd0000000000000;
    ((undefined8 *)
    ((long)depth_range_data_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start + lVar11))[1] = 0x3fe8000000000000;
    (*(depthFunc.m_gl)->depthRangeIndexed)((GLuint)lVar7,0.25,0.75);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"depthRangeIndexed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0x8a7);
    getDepthRanges<double>(this,&depthFunc,max_viewports,&depth_range_data_a);
    compareDepthRanges<double>
              (this,&depth_range_data_a,&depth_range_data_b,"depthRangeIndexed",&test_result);
    lVar11 = lVar11 + 0x10;
  }
  uVar8 = 3;
  lVar7 = 0;
  uVar10 = 0;
  while ((long)uVar10 < (long)max_viewports) {
    dVar2 = *(double *)(&DAT_017dc310 + (ulong)((uVar10 & 1) == 0) * 8);
    for (lVar11 = 0; lVar7 != lVar11; lVar11 = lVar11 + 0x10) {
      *(double *)
       ((long)depth_range_data_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + lVar11) = dVar2;
      *(double *)
       ((long)depth_range_data_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + lVar11 + 8) = dVar2;
    }
    uVar10 = uVar10 + 1;
    iVar4 = (int)uVar8;
    for (uVar9 = uVar10 & 0xffffffff; (int)uVar9 < max_viewports; uVar9 = (ulong)((int)uVar9 + 1)) {
      depth_range_data_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[(int)uVar8 - 1] = dVar2;
      depth_range_data_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[uVar8] = dVar2;
      uVar8 = (ulong)((int)uVar8 + 2);
    }
    (*(depthFunc.m_gl)->depthRangeArrayv)
              (0,max_viewports,
               depth_range_data_b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"depthRangeArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0x8c3);
    getDepthRanges<double>(this,&depthFunc,max_viewports,&depth_range_data_a);
    lVar7 = lVar7 + 0x10;
    uVar8 = (ulong)(iVar4 + 2);
    compareDepthRanges<double>
              (this,&depth_range_data_a,&depth_range_data_b,"depthRangeArray",&test_result);
  }
  lVar7 = 0;
  uVar8 = 0;
  if (0 < max_viewports) {
    uVar8 = (ulong)(uint)max_viewports;
  }
  for (; uVar8 * 0x10 != lVar7; lVar7 = lVar7 + 0x10) {
    puVar1 = (undefined4 *)
             ((long)depth_range_data_a.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start + lVar7);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1[2] = 0;
    puVar1[3] = 0x3ff00000;
  }
  (*(depthFunc.m_gl)->depthRange)(0.0,1.0);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"depthRange",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                  ,0x8d4);
  getDepthRanges<double>(this,&depthFunc,max_viewports,&depth_range_data_b);
  compareDepthRanges<double>(this,&depth_range_data_a,&depth_range_data_b,"depthRange",&test_result)
  ;
  bVar3 = test_result;
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&depth_range_data_b.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&depth_range_data_a.super__Vector_base<double,_std::allocator<double>_>);
  return bVar3;
}

Assistant:

bool DepthRangeAPI::iterateHelper(T*)
{
	/* GL entry points */
	const glw::Functions&   gl = m_context.getRenderContext().getFunctions();
	Utils::DepthFuncWrapper depthFunc(m_context);

	bool test_result = true;

	GLint max_viewports = 0;

	gl.getIntegerv(GL_MAX_VIEWPORTS, &max_viewports);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

	std::vector<T> depth_range_data_a;
	std::vector<T> depth_range_data_b;

	depth_range_data_a.resize(max_viewports * m_n_elements);
	depth_range_data_b.resize(max_viewports * m_n_elements);

	/*
	 *   - get initial values of DEPTH_RANGE for all MAX_VIEWPORTS indices;
	 *   - change values of all indices at once with DepthRangeArrayv;
	 *   - get DEPTH_RANGE for all MAX_VIEWPORTS indices and verify results;
	 */
	getDepthRanges(depthFunc, max_viewports, depth_range_data_a);

	for (GLint i = 0; i < max_viewports; ++i)
	{
		depth_range_data_a[i * m_n_elements + 0] += 0.125;
		depth_range_data_a[i * m_n_elements + 1] -= 0.125;
	}

	depthFunc.depthRangeArray(0, max_viewports, &depth_range_data_a[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "depthRangeArray");

	getDepthRanges(depthFunc, max_viewports, depth_range_data_b);
	compareDepthRanges(depth_range_data_a, depth_range_data_b, "depthRangeArray", test_result);

	/*
	 *   - for each index:
	 *     * modify with DepthRangeIndexed,
	 *     * get DEPTH_RANGE for all MAX_VIEWPORTS indices and verify results;
	 */
	for (GLint i = 0; i < max_viewports; ++i)
	{
		depth_range_data_b[i * m_n_elements + 0] = 0.25;
		depth_range_data_b[i * m_n_elements + 1] = 0.75;

		depthFunc.depthRangeIndexed(i, (T)0.25, (T)0.75);
		GLU_EXPECT_NO_ERROR(gl.getError(), "depthRangeIndexed");

		getDepthRanges(depthFunc, max_viewports, depth_range_data_a);
		compareDepthRanges(depth_range_data_a, depth_range_data_b, "depthRangeIndexed", test_result);
	}

	/*
	 *   - for each index:
	 *     * modify all indices before and after current one with DepthRangeArrayv,
	 *     * get DEPTH_RANGE for all MAX_VIEWPORTS indices and verify results;
	 */
	for (GLint i = 0; i < max_viewports; ++i)
	{
		const T value = (0 == i % 2) ? T(1.0) : T(0.25);

		for (GLint j = 0; j < i; ++j)
		{
			depth_range_data_b[j * m_n_elements + 0] = value;
			depth_range_data_b[j * m_n_elements + 1] = value;
		}

		for (GLint j = i + 1; j < max_viewports; ++j)
		{
			depth_range_data_b[j * m_n_elements + 0] = value;
			depth_range_data_b[j * m_n_elements + 1] = value;
		}

		depthFunc.depthRangeArray(0, max_viewports, &depth_range_data_b[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "depthRangeArray");

		getDepthRanges(depthFunc, max_viewports, depth_range_data_a);
		compareDepthRanges(depth_range_data_a, depth_range_data_b, "depthRangeArray", test_result);
	}

	/*
	 *   - change values of all indices at once with DepthRange;
	 *   - get DEPTH_RANGE for all MAX_VIEWPORTS indices and verify results;
	 */
	for (GLint i = 0; i < max_viewports; ++i)
	{
		depth_range_data_a[i * m_n_elements + 0] = 0.0f;
		depth_range_data_a[i * m_n_elements + 1] = 1.0f;
	}

	depthFunc.depthRange((T)0.0, (T)1.0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "depthRange");

	getDepthRanges(depthFunc, max_viewports, depth_range_data_b);
	compareDepthRanges(depth_range_data_a, depth_range_data_b, "depthRange", test_result);

	return test_result;
}